

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_dataWindow
          (exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,char *tname
          ,int32_t attrsz)

{
  undefined8 *puVar1;
  int iVar2;
  exr_result_t eVar3;
  char *in_RCX;
  _internal_exr_seq_scratch *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  int32_t in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  exr_result_t rv;
  exr_attr_box2i_t tmpdata;
  int32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  memset(&stack0xffffffffffffffc4,0,0x10);
  iVar2 = strcmp(in_RCX,"box2i");
  if (iVar2 == 0) {
    eVar3 = extract_attr_32bit(in_RSI,in_RDX,in_RCX,
                               (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                               ,in_stack_ffffffffffffffc4,unaff_retaddr);
    if (eVar3 == 0) {
      if (in_RSI->do_write == (_func_exr_result_t_exr_context_t_void_ptr_uint64_t_uint64_t_ptr *)0x0
         ) {
        eVar3 = exr_attr_list_add_static_name
                          ((exr_context_t)CONCAT44(attrsz,tmpdata.max.y),
                           (exr_attribute_list_t *)tmpdata._4_8_,_rv,unaff_retaddr_00,unaff_retaddr,
                           (uint8_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(exr_attribute_t **)curpart);
        if (eVar3 == 0) {
          puVar1 = *(undefined8 **)(in_RSI->do_write + 0x18);
          *puVar1 = CONCAT44(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
          puVar1[1] = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          in_RSI->destroy_fn =
               (exr_destroy_stream_func_ptr_t)
               CONCAT44(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
          in_RSI->file_size = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          eVar3 = 0;
        }
        else {
          eVar3 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,eVar3,"Unable to initialize attribute \'%s\', type \'box2i\'",
                             "dataWindow");
        }
      }
      else if (*(char *)(in_RDI + 6) == '\0') {
        puVar1 = *(undefined8 **)(in_RSI->do_write + 0x18);
        *puVar1 = CONCAT44(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
        puVar1[1] = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        in_RSI->destroy_fn =
             (exr_destroy_stream_func_ptr_t)
             CONCAT44(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
        in_RSI->file_size = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        eVar3 = 0;
      }
      else {
        eVar3 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,"Duplicate copy of required attribute \'%s\' encountered",
                           "dataWindow");
      }
    }
  }
  else {
    (*in_RDX->sequential_skip)(in_RDX,in_R8D);
    eVar3 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,"Required attribute \'%s\': Invalid type \'%s\'","dataWindow",
                       in_RCX);
  }
  return eVar3;
}

Assistant:

static exr_result_t
check_populate_dataWindow (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_attr_box2i_t tmpdata = {0};
    exr_result_t     rv;

    if (0 != strcmp (tname, "box2i"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute '%s': Invalid type '%s'",
            EXR_REQ_DATA_STR,
            tname);
    }

    rv = extract_attr_32bit (
        ctxt, scratch, &(tmpdata), EXR_REQ_DATA_STR, tname, attrsz, 4);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (curpart->dataWindow)
    {
        if (ctxt->strict_header)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Duplicate copy of required attribute '%s' encountered",
                EXR_REQ_DATA_STR);
        }

        /* legacy code allowed attributes to just overwrite, preserve
         * that behavior (barring other failure)
         */
        *(curpart->dataWindow->box2i) = tmpdata;
        curpart->data_window          = tmpdata;
        return EXR_ERR_SUCCESS;
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_DATA_STR,
        EXR_ATTR_BOX2I,
        0,
        NULL,
        &(curpart->dataWindow));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'box2i'",
            EXR_REQ_DATA_STR);

    *(curpart->dataWindow->box2i) = tmpdata;
    curpart->data_window          = tmpdata;
    return rv;
}